

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

WebPInfoStatus
ParseLosslessTransform(WebPInfo *webp_info,uint8_t *data,size_t data_size,uint64_t *bit_pos)

{
  int iVar1;
  uint64_t *in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  char *pcVar2;
  long in_RDI;
  int type;
  int n_colors;
  int block_size;
  int use_transform;
  uint local_38;
  uint local_34;
  uint local_30;
  int local_2c;
  uint64_t *local_28;
  size_t local_20;
  uint8_t *local_18;
  long local_10;
  WebPInfoStatus local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = LLGetBits(in_RSI,in_RDX,1,&local_2c,in_RCX);
  if (iVar1 == 0) {
    if (*(int *)(local_10 + 0x70) != 0) {
      fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
    }
    local_4 = WEBP_INFO_TRUNCATED_DATA;
  }
  else {
    pcVar2 = "No";
    if (local_2c != 0) {
      pcVar2 = "Yes";
    }
    printf("  Use transform:    %s\n",pcVar2);
    if (local_2c != 0) {
      iVar1 = LLGetBits(local_18,local_20,2,(int *)&local_38,local_28);
      if (iVar1 == 0) {
        if (*(int *)(local_10 + 0x70) != 0) {
          fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
        }
        return WEBP_INFO_TRUNCATED_DATA;
      }
      printf("  1st transform:    %s (%d)\n",kLosslessTransforms[(int)local_38],(ulong)local_38);
      if (local_38 < 2) {
        iVar1 = LLGetBits(local_18,local_20,3,(int *)&local_30,local_28);
        if (iVar1 == 0) {
          if (*(int *)(local_10 + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
          }
          return WEBP_INFO_TRUNCATED_DATA;
        }
        local_30 = 1 << ((char)local_30 + 2U & 0x1f);
        printf("  Tran. block size: %d\n",(ulong)local_30);
      }
      else if (local_38 == 3) {
        iVar1 = LLGetBits(local_18,local_20,8,(int *)&local_34,local_28);
        if (iVar1 == 0) {
          if (*(int *)(local_10 + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
          }
          return WEBP_INFO_TRUNCATED_DATA;
        }
        local_34 = local_34 + 1;
        printf("  No. of colors:    %d\n",(ulong)local_34);
      }
    }
    local_4 = WEBP_INFO_OK;
  }
  return local_4;
}

Assistant:

static WebPInfoStatus ParseLosslessTransform(WebPInfo* const webp_info,
                                             const uint8_t* const data,
                                             size_t data_size,
                                             uint64_t* const  bit_pos) {
  int use_transform, block_size, n_colors;
  LL_GET_BITS(use_transform, 1);
  printf("  Use transform:    %s\n", use_transform ? "Yes" : "No");
  if (use_transform) {
    int type;
    LL_GET_BITS(type, 2);
    printf("  1st transform:    %s (%d)\n", kLosslessTransforms[type], type);
    switch (type) {
      case PREDICTOR_TRANSFORM:
      case CROSS_COLOR_TRANSFORM:
        LL_GET_BITS(block_size, 3);
        block_size = 1 << (block_size + 2);
        printf("  Tran. block size: %d\n", block_size);
        break;
      case COLOR_INDEXING_TRANSFORM:
        LL_GET_BITS(n_colors, 8);
        n_colors += 1;
        printf("  No. of colors:    %d\n", n_colors);
        break;
      default: break;
    }
  }
  return WEBP_INFO_OK;
}